

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interner.h
# Opt level: O2

void SymbolInterner::Initialize(void)

{
  SymbolInterner *pSVar1;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  allocator local_19;
  
  if (g_the_interner == (SymbolInterner *)0x0) {
    pSVar1 = (SymbolInterner *)operator_new(0x50);
    (pSVar1->map)._M_h._M_buckets = &(pSVar1->map)._M_h._M_single_bucket;
    (pSVar1->map)._M_h._M_bucket_count = 1;
    (pSVar1->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pSVar1->map)._M_h._M_element_count = 0;
    (pSVar1->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pSVar1->map)._M_h._M_rehash_policy._M_next_resize = 0;
    (pSVar1->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pSVar1->vec).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar1->vec).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar1->vec).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    g_the_interner = pSVar1;
    std::__cxx11::string::string((string *)&local_1e0,"quote",&local_19);
    Intern(pSVar1,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_1c0,"define",&local_19);
    Intern(pSVar1,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_1a0,"set!",&local_19);
    Intern(pSVar1,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_180,"lambda",&local_19);
    Intern(pSVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_160,"if",&local_19);
    Intern(pSVar1,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_140,"begin",&local_19);
    Intern(pSVar1,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_120,"unquote",&local_19);
    Intern(pSVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_100,"unquote-splicing",&local_19);
    Intern(pSVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_e0,"quasiquote",&local_19);
    Intern(pSVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_c0,"append",&local_19);
    Intern(pSVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_a0,"defmacro",&local_19);
    Intern(pSVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_80,"let",&local_19);
    Intern(pSVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_60,"and",&local_19);
    Intern(pSVar1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pSVar1 = g_the_interner;
    std::__cxx11::string::string((string *)&local_40,"or",&local_19);
    Intern(pSVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  __assert_fail("g_the_interner == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/interner.h"
                ,0x4a,"static void SymbolInterner::Initialize()");
}

Assistant:

static void Initialize() {
    assert(g_the_interner == nullptr);
    g_the_interner = new SymbolInterner();
    g_the_interner->Intern("quote");
    g_the_interner->Intern("define");
    g_the_interner->Intern("set!");
    g_the_interner->Intern("lambda");
    g_the_interner->Intern("if");
    g_the_interner->Intern("begin");
    g_the_interner->Intern("unquote");
    g_the_interner->Intern("unquote-splicing");
    g_the_interner->Intern("quasiquote");
    g_the_interner->Intern("append");
    g_the_interner->Intern("defmacro");
    g_the_interner->Intern("let");
    g_the_interner->Intern("and");
    g_the_interner->Intern("or");
  }